

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreply.cpp
# Opt level: O1

void QNetworkReply::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QNetworkReply_to_subr *candidate;
  undefined8 *puVar2;
  undefined4 uVar3;
  void **ppvVar4;
  InterfaceType *pIVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined8 local_40;
  void *local_38;
  undefined8 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 4) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
LAB_00196a8f:
        *puVar2 = pIVar5;
        goto LAB_00196be5;
      }
    }
    else if (_id == 6) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
        goto LAB_00196a8f;
      }
    }
    else if (_id == 7) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_00196a8f;
      }
    }
    else {
      puVar2 = (undefined8 *)*_a;
    }
    *puVar2 = 0;
    goto LAB_00196be5;
  }
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if (((((((code *)*plVar1 == socketStartedConnecting) && (uVar3 = 0, plVar1[1] == 0)) ||
          (((code *)*plVar1 == requestSent && (uVar3 = 1, plVar1[1] == 0)))) ||
         (((code *)*plVar1 == metaDataChanged && (uVar3 = 2, plVar1[1] == 0)))) ||
        (((((code *)*plVar1 == finished && (uVar3 = 3, plVar1[1] == 0)) ||
          ((((code *)*plVar1 == errorOccurred && (uVar3 = 4, plVar1[1] == 0)) ||
           (((code *)*plVar1 == encrypted && (uVar3 = 5, plVar1[1] == 0)))))) ||
         ((((code *)*plVar1 == sslErrors && (uVar3 = 6, plVar1[1] == 0)) ||
          (((code *)*plVar1 == preSharedKeyAuthenticationRequired && (uVar3 = 7, plVar1[1] == 0)))))
         ))) || (((((code *)*plVar1 == redirected && (uVar3 = 8, plVar1[1] == 0)) ||
                  (((code *)*plVar1 == redirectAllowed && (uVar3 = 9, plVar1[1] == 0)))) ||
                 ((((code *)*plVar1 == uploadProgress && (uVar3 = 10, plVar1[1] == 0)) ||
                  (((code *)*plVar1 == downloadProgress && (uVar3 = 0xb, plVar1[1] == 0)))))))) {
      *(undefined4 *)*_a = uVar3;
    }
    goto LAB_00196be5;
  }
  if (_c != InvokeMetaMethod) goto LAB_00196be5;
  switch(_id) {
  case 0:
    iVar6 = 0;
    break;
  case 1:
    iVar6 = 1;
    break;
  case 2:
    iVar6 = 2;
    break;
  case 3:
    iVar6 = 3;
    break;
  case 4:
    puStack_30 = &local_40;
    local_40 = CONCAT44(local_40._4_4_,*_a[1]);
    ppvVar4 = &local_38;
    local_38 = (void *)0x0;
    iVar6 = 4;
    goto LAB_00196a2d;
  case 5:
    iVar6 = 5;
    break;
  case 6:
    puStack_30 = (undefined8 *)_a[1];
    ppvVar4 = &local_38;
    local_38 = (void *)0x0;
    iVar6 = 6;
    goto LAB_00196a2d;
  case 7:
    local_40 = *_a[1];
    puStack_30 = &local_40;
    ppvVar4 = &local_38;
    local_38 = (void *)0x0;
    iVar6 = 7;
    goto LAB_00196a2d;
  case 8:
    puStack_30 = (undefined8 *)_a[1];
    ppvVar4 = &local_38;
    local_38 = (void *)0x0;
    iVar6 = 8;
    goto LAB_00196a2d;
  case 9:
    iVar6 = 9;
    break;
  case 10:
    uploadProgress((QNetworkReply *)_o,*_a[1],*_a[2]);
    goto LAB_00196be5;
  case 0xb:
    downloadProgress((QNetworkReply *)_o,*_a[1],*_a[2]);
    goto LAB_00196be5;
  case 0xc:
    (**(code **)(*(long *)_o + 0xf0))();
    goto LAB_00196be5;
  case 0xd:
    (**(code **)(*(long *)_o + 0xf8))();
  default:
    goto LAB_00196be5;
  }
  ppvVar4 = (void **)0x0;
LAB_00196a2d:
  QMetaObject::activate(_o,&staticMetaObject,iVar6,ppvVar4);
LAB_00196be5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReply::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkReply *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->socketStartedConnecting(); break;
        case 1: _t->requestSent(); break;
        case 2: _t->metaDataChanged(); break;
        case 3: _t->finished(); break;
        case 4: _t->errorOccurred((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 5: _t->encrypted(); break;
        case 6: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 7: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 8: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 9: _t->redirectAllowed(); break;
        case 10: _t->uploadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 11: _t->downloadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 12: _t->abort(); break;
        case 13: _t->ignoreSslErrors(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::socketStartedConnecting, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::requestSent, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::metaDataChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::finished, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(QNetworkReply::NetworkError )>(_a, &QNetworkReply::errorOccurred, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::encrypted, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(const QList<QSslError> & )>(_a, &QNetworkReply::sslErrors, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QNetworkReply::preSharedKeyAuthenticationRequired, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(const QUrl & )>(_a, &QNetworkReply::redirected, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)()>(_a, &QNetworkReply::redirectAllowed, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(qint64 , qint64 )>(_a, &QNetworkReply::uploadProgress, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkReply::*)(qint64 , qint64 )>(_a, &QNetworkReply::downloadProgress, 11))
            return;
    }
}